

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessageData::FinalizeEncodingAndFormat
          (LogMessageData *this)

{
  LogSeverity severity;
  uint tid;
  Duration timestamp;
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  size_t sVar4;
  ulong uVar5;
  ulong in_RCX;
  size_type __n;
  array<char,_15000UL> *paVar6;
  string_view basename;
  string_view file;
  LogMessageData *pLStackY_110;
  size_type sStackY_f0;
  Span<char> local_c8;
  char *local_b8;
  ulong local_b0;
  array<char,_15000UL> *local_a8;
  Span<const_char> encoded_data;
  ProtoField local_90;
  ProtoField field;
  Span<const_char> local_40;
  
  paVar6 = &this->encoded_buf;
  pcVar3 = (this->encoded_remaining_actual_do_not_use_directly).ptr_;
  if (pcVar3 == (pointer)0x0) {
    (this->encoded_remaining_actual_do_not_use_directly).ptr_ = paVar6->_M_elems;
    (this->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    InitializeEncodingAndFormat(this);
    pcVar3 = (this->encoded_remaining_actual_do_not_use_directly).ptr_;
  }
  encoded_data.len_ = (long)pcVar3 - (long)paVar6;
  local_c8.ptr_ = (this->string_buf)._M_elems;
  local_c8.len_ = 0x3a96;
  local_a8 = (array<char,_15000UL> *)local_c8.ptr_;
  encoded_data.ptr_ = paVar6->_M_elems;
  if ((this->entry).prefix_ == true) {
    severity = (this->entry).severity_;
    timestamp = (this->entry).timestamp_.rep_;
    tid = (this->entry).tid_;
    sVar4 = (this->entry).base_filename_._M_len;
    local_b8 = (this->entry).base_filename_._M_str;
    local_b0 = (ulong)(uint)(this->entry).line_;
    bVar1 = ThreadIsLoggingToLogSink();
    in_RCX = (ulong)tid;
    sStackY_f0 = 0x2ad6a4;
    basename._M_str = local_b8;
    basename._M_len = sVar4;
    sVar4 = FormatLogPrefix(severity,(Time)timestamp,tid,basename,(int)local_b0,(uint)bVar1,
                            &local_c8);
  }
  else {
    sVar4 = 0;
  }
  (this->entry).prefix_len_ = sVar4;
  field.data_.ptr_ = (pointer)0x0;
  field.data_.len_ = 0;
  bVar1 = ProtoField::DecodeFrom(&field,&encoded_data);
  if (bVar1) {
    do {
      if ((field.tag_ == 7) && (field.type_ == kLengthDelimited)) {
        local_40.ptr_ = field.data_.ptr_;
        local_40.len_ = field.data_.len_;
        if (1 < local_c8.len_) {
          local_90.data_.ptr_ = (pointer)0x0;
          local_90.data_.len_ = 0;
          do {
            do {
              bVar1 = ProtoField::DecodeFrom(&local_90,&local_40);
              if (!bVar1) goto LAB_002ad70a;
            } while (((local_90.tag_ != 6) && (local_90.tag_ != 1)) ||
                    (local_90.type_ != kLengthDelimited));
            __n = local_90.data_.len_;
            if (local_c8.len_ < local_90.data_.len_) {
              __n = local_c8.len_;
            }
            paVar6 = (array<char,_15000UL> *)local_c8.ptr_;
            memcpy(local_c8.ptr_,local_90.data_.ptr_,__n);
            iVar2 = (int)in_RCX;
            uVar5 = local_c8.len_ - __n;
            if (local_c8.len_ < __n) {
              FinalizeEncodingAndFormat();
              bVar1 = IsInitialized();
              if ((bVar1) &&
                 (file._M_str._4_4_ = 0,
                 file._0_12_ = *(undefined1 (*) [12])(*(long *)(paVar6->_M_elems + 8) + 0x18),
                 bVar1 = ShouldLogBacktraceAt
                                   (*(log_internal **)(*(long *)(paVar6->_M_elems + 8) + 0x10),file,
                                    iVar2), bVar1)) {
                OstreamView::OstreamView
                          ((OstreamView *)&stack0xfffffffffffffeb0,
                           *(LogMessageData **)(paVar6->_M_elems + 8));
                std::__ostream_insert<char,std::char_traits<char>>
                          (&pLStackY_110->manipulated," (stacktrace:\n",0xe);
                iVar2 = MaxFramesInLogStackTrace();
                bVar1 = ShouldSymbolizeLogStackTrace();
                debugging_internal::DumpStackTrace
                          (1,iVar2,bVar1,anon_unknown_4::WriteToStream,&pLStackY_110->manipulated);
                std::__ostream_insert<char,std::char_traits<char>>
                          (&pLStackY_110->manipulated,") ",2);
                OstreamView::~OstreamView((OstreamView *)&stack0xfffffffffffffeb0);
              }
              return;
            }
            local_c8.ptr_ = local_c8.ptr_ + __n;
            local_c8.len_ = uVar5;
          } while (local_90.data_.len_ <= __n);
        }
      }
LAB_002ad70a:
      bVar1 = ProtoField::DecodeFrom(&field,&encoded_data);
    } while (bVar1);
  }
  *(undefined2 *)((long)this + (long)local_c8.ptr_ + (0x3cd8 - (long)local_a8)) = 10;
  uVar5 = (long)local_c8.ptr_ + (2 - (long)local_a8);
  if (14999 < uVar5) {
    uVar5 = 15000;
  }
  (this->entry).text_message_with_prefix_and_newline_and_nul_.ptr_ = local_a8->_M_elems;
  (this->entry).text_message_with_prefix_and_newline_and_nul_.len_ = uVar5;
  return;
}

Assistant:

void LogMessage::LogMessageData::FinalizeEncodingAndFormat() {
  // Note that `encoded_remaining()` may have zero size without pointing past
  // the end of `encoded_buf`, so the difference between `data()` pointers is
  // used to compute the size of `encoded_data`.
  absl::Span<const char> encoded_data(
      encoded_buf.data(),
      static_cast<size_t>(encoded_remaining().data() - encoded_buf.data()));
  // `string_remaining` is the suffix of `string_buf` that has not been filled
  // yet.
  absl::Span<char> string_remaining(string_buf);
  // We may need to write a newline and nul-terminator at the end of the decoded
  // string data.  Rather than worry about whether those should overwrite the
  // end of the string (if the buffer is full) or be appended, we avoid writing
  // into the last two bytes so we always have space to append.
  string_remaining.remove_suffix(2);
  entry.prefix_len_ =
      entry.prefix() ? log_internal::FormatLogPrefix(
                           entry.log_severity(), entry.timestamp(), entry.tid(),
                           entry.source_basename(), entry.source_line(),
                           log_internal::ThreadIsLoggingToLogSink()
                               ? PrefixFormat::kRaw
                               : PrefixFormat::kNotRaw,
                           string_remaining)
                     : 0;
  // Decode data from `encoded_buf` until we run out of data or we run out of
  // `string_remaining`.
  ProtoField field;
  while (field.DecodeFrom(&encoded_data)) {
    switch (field.tag()) {
      case EventTag::kValue:
        if (field.type() != WireType::kLengthDelimited) continue;
        if (PrintValue(string_remaining, field.bytes_value())) continue;
        break;
    }
  }
  auto chars_written =
      static_cast<size_t>(string_remaining.data() - string_buf.data());
    string_buf[chars_written++] = '\n';
  string_buf[chars_written++] = '\0';
  entry.text_message_with_prefix_and_newline_and_nul_ =
      absl::MakeSpan(string_buf).subspan(0, chars_written);
}